

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

string * __thiscall
cmLocalGenerator::GetObjectFileNameWithoutTarget
          (string *__return_storage_ptr__,cmLocalGenerator *this,cmSourceFile *source,
          string *dir_max,bool *hasSourceExtension,char *customOutputExtension)

{
  cmMakefile *this_00;
  cmLocalGenerator *this_01;
  bool bVar1;
  string *psVar2;
  string *psVar3;
  string *psVar4;
  cmValue cVar5;
  cmValue cVar6;
  long lVar7;
  pointer pcVar8;
  byte bVar9;
  bool bVar10;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string objectName;
  string relFromBinary;
  string relFromSource;
  string lang;
  RegularExpression var;
  string local_1c8;
  pointer local_1a8;
  cmLocalGenerator *local_1a0;
  string local_198;
  bool *local_178;
  string *local_170;
  string *local_168;
  string local_160;
  undefined1 local_140 [32];
  undefined1 local_120 [16];
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> local_110 [3];
  char *local_80;
  char *local_70;
  char *local_60;
  int local_58;
  string local_50;
  
  local_1a8 = customOutputExtension;
  local_168 = __return_storage_ptr__;
  psVar2 = cmSourceFile::GetFullPath_abi_cxx11_(source);
  psVar3 = cmake::GetHomeDirectory_abi_cxx11_(this->GlobalGenerator->CMakeInstance);
  local_1a0 = this;
  cmStateSnapshot::GetDirectory
            ((cmStateDirectory *)local_120,&(this->super_cmOutputConverter).StateSnapshot);
  psVar4 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)local_120);
  anon_unknown.dwarf_14f99e::relativeIfUnder(&local_160,psVar3,psVar4,psVar2);
  if (local_160._M_string_length == 0) {
    __assert_fail("!relFromSource.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmLocalGenerator.cxx"
                  ,0xec4,
                  "std::string cmLocalGenerator::GetObjectFileNameWithoutTarget(const cmSourceFile &, const std::string &, bool *, const char *)"
                 );
  }
  cmsys::SystemTools::FileIsFullPath(&local_160);
  local_178 = hasSourceExtension;
  local_170 = dir_max;
  psVar3 = cmake::GetHomeOutputDirectory_abi_cxx11_(local_1a0->GlobalGenerator->CMakeInstance);
  cmStateSnapshot::GetDirectory
            ((cmStateDirectory *)local_120,&(this->super_cmOutputConverter).StateSnapshot);
  psVar4 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_120);
  anon_unknown.dwarf_14f99e::relativeIfUnder(&local_198,psVar3,psVar4,psVar2);
  if (local_198._M_string_length != 0) {
    cmsys::SystemTools::FileIsFullPath(&local_198);
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    local_1c8._M_string_length = 0;
    local_1c8.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::_M_assign((string *)&local_1c8);
    this_01 = local_1a0;
    bVar1 = cmsys::SystemTools::FileIsFullPath(&local_1c8);
    if ((bVar1) &&
       (bVar1 = cmake::GetIsInTryCompile(this_01->GlobalGenerator->CMakeInstance), bVar1)) {
      psVar2 = cmSourceFile::GetFullPath_abi_cxx11_(source);
      cmsys::SystemTools::GetFilenameName((string *)local_120,psVar2);
      std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_120);
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_120._0_8_ != local_110
         ) {
        operator_delete((void *)local_120._0_8_,
                        (ulong)((long)local_110[0].Data.
                                      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1));
      }
    }
    local_120._0_8_ = local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"UNITY_SOURCE_FILE","");
    cVar5 = cmSourceFile::GetProperty(source,(string *)local_120);
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_120._0_8_ != local_110)
    {
      operator_delete((void *)local_120._0_8_,
                      (ulong)((long)local_110[0].Data.
                                    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1));
    }
    local_120._0_8_ = local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"PCH_EXTENSION","");
    cVar6 = cmSourceFile::GetProperty(source,(string *)local_120);
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_120._0_8_ != local_110)
    {
      operator_delete((void *)local_120._0_8_,
                      (ulong)((long)local_110[0].Data.
                                    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1));
    }
    lVar7 = std::__cxx11::string::find((char *)&local_1c8,0x6ec28a,0);
    pcVar8 = local_1a8;
    if (((cVar5.Value != (string *)0x0) || (cVar6.Value != (string *)0x0)) || (lVar7 != -1)) {
      if (cVar6.Value != (string *)0x0) {
        pcVar8 = ((cVar6.Value)->_M_dataplus)._M_p;
      }
      local_70 = (char *)0x0;
      local_60 = (char *)0x0;
      local_58 = 0;
      memset((RegularExpression *)local_120,0,0xaa);
      cmsys::RegularExpression::compile((RegularExpression *)local_120,"(CMakeFiles/[^/]+.dir/)");
      bVar1 = cmsys::RegularExpression::find
                        ((RegularExpression *)local_120,local_1c8._M_dataplus._M_p,
                         (RegularExpressionMatch *)local_120);
      if (bVar1) {
        std::__cxx11::string::erase((ulong)&local_1c8,local_120._0_8_ - (long)local_80);
      }
      if (local_60 != (char *)0x0) {
        operator_delete__(local_60);
      }
    }
    local_120._0_8_ = local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"KEEP_EXTENSION","");
    bVar1 = cmSourceFile::GetPropertyAsBool(source,(string *)local_120);
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_120._0_8_ != local_110)
    {
      operator_delete((void *)local_120._0_8_,
                      (ulong)((long)local_110[0].Data.
                                    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1));
    }
    bVar10 = true;
    if (!bVar1) {
      bVar1 = NeedBackwardsCompatibility_2_4(this_01);
      if (!bVar1) {
        cmSourceFile::GetLanguage_abi_cxx11_((string *)local_140,source);
        if ((cmState *)local_140._8_8_ != (cmState *)0x0) {
          this_00 = this_01->Makefile;
          local_120._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x6;
          local_120._8_8_ = "CMAKE_";
          local_110[0].Data.
          super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_140._8_8_;
          local_110[0].Data.
          super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_140._0_8_;
          local_110[0].Data.
          super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x19;
          local_110[0].UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x6ac5ca;
          views._M_len = 3;
          views._M_array = (iterator)local_120;
          cmCatViews_abi_cxx11_(&local_50,views);
          bVar1 = cmMakefile::IsOn(this_00,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        if ((cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_140._0_8_ !=
            (cmLinkedTree<cmStateDetail::SnapshotDataType> *)(local_140 + 0x10)) {
          operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
        }
      }
      bVar9 = pcVar8 != (pointer)0x0 | bVar1;
      if ((bVar9 == 1) && (lVar7 = std::__cxx11::string::rfind((char)&local_1c8,0x2e), lVar7 != -1))
      {
        std::__cxx11::string::substr((ulong)local_120,(ulong)&local_1c8);
        std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_120);
        if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_120._0_8_ !=
            local_110) {
          operator_delete((void *)local_120._0_8_,
                          (ulong)((long)local_110[0].Data.
                                        super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 1));
        }
      }
      if (pcVar8 == (pointer)0x0) {
        cmGlobalGenerator::GetLanguageOutputExtension_abi_cxx11_
                  ((string *)local_120,this_01->GlobalGenerator,source);
        std::__cxx11::string::_M_append((char *)&local_1c8,local_120._0_8_);
        if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_120._0_8_ !=
            local_110) {
          operator_delete((void *)local_120._0_8_,
                          (ulong)((long)local_110[0].Data.
                                        super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 1));
        }
      }
      else {
        std::__cxx11::string::append((char *)&local_1c8);
      }
      bVar10 = (bool)(bVar9 ^ 1);
    }
    if (local_178 != (bool *)0x0) {
      *local_178 = bVar10;
    }
    psVar3 = CreateSafeUniqueObjectFileName(this_01,&local_1c8,local_170);
    psVar2 = local_168;
    (local_168->_M_dataplus)._M_p = (pointer)&local_168->field_2;
    pcVar8 = (psVar3->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_168,pcVar8,pcVar8 + psVar3->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,
                      CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                               local_1c8.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    return psVar2;
  }
  __assert_fail("!relFromBinary.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmLocalGenerator.cxx"
                ,0xecb,
                "std::string cmLocalGenerator::GetObjectFileNameWithoutTarget(const cmSourceFile &, const std::string &, bool *, const char *)"
               );
}

Assistant:

std::string cmLocalGenerator::GetObjectFileNameWithoutTarget(
  const cmSourceFile& source, std::string const& dir_max,
  bool* hasSourceExtension, char const* customOutputExtension)
{
  // Construct the object file name using the full path to the source
  // file which is its only unique identification.
  std::string const& fullPath = source.GetFullPath();

  // Try referencing the source relative to the source tree.
  std::string relFromSource = relativeIfUnder(
    this->GetSourceDirectory(), this->GetCurrentSourceDirectory(), fullPath);
  assert(!relFromSource.empty());
  bool relSource = !cmSystemTools::FileIsFullPath(relFromSource);
  bool subSource = relSource && relFromSource[0] != '.';

  // Try referencing the source relative to the binary tree.
  std::string relFromBinary = relativeIfUnder(
    this->GetBinaryDirectory(), this->GetCurrentBinaryDirectory(), fullPath);
  assert(!relFromBinary.empty());
  bool relBinary = !cmSystemTools::FileIsFullPath(relFromBinary);
  bool subBinary = relBinary && relFromBinary[0] != '.';

  // Select a nice-looking reference to the source file to construct
  // the object file name.
  std::string objectName;
  // XXX(clang-tidy): https://bugs.llvm.org/show_bug.cgi?id=44165
  // NOLINTNEXTLINE(bugprone-branch-clone)
  if ((relSource && !relBinary) || (subSource && !subBinary)) {
    objectName = relFromSource;
  } else if ((relBinary && !relSource) || (subBinary && !subSource) ||
             relFromBinary.length() < relFromSource.length()) {
    objectName = relFromBinary;
  } else {
    objectName = relFromSource;
  }

  // if it is still a full path check for the try compile case
  // try compile never have in source sources, and should not
  // have conflicting source file names in the same target
  if (cmSystemTools::FileIsFullPath(objectName)) {
    if (this->GetGlobalGenerator()->GetCMakeInstance()->GetIsInTryCompile()) {
      objectName = cmSystemTools::GetFilenameName(source.GetFullPath());
    }
  }

  // Ensure that for the CMakeFiles/<target>.dir/generated_source_file
  // we don't end up having:
  // CMakeFiles/<target>.dir/CMakeFiles/<target>.dir/generated_source_file.obj
  cmValue unitySourceFile = source.GetProperty("UNITY_SOURCE_FILE");
  cmValue pchExtension = source.GetProperty("PCH_EXTENSION");
  const bool isPchObject = objectName.find("cmake_pch") != std::string::npos;
  if (unitySourceFile || pchExtension || isPchObject) {
    if (pchExtension) {
      customOutputExtension = pchExtension->c_str();
    }

    cmsys::RegularExpression var("(CMakeFiles/[^/]+.dir/)");
    if (var.find(objectName)) {
      objectName.erase(var.start(), var.end() - var.start());
    }
  }

  // Replace the original source file extension with the object file
  // extension.
  bool keptSourceExtension = true;
  if (!source.GetPropertyAsBool("KEEP_EXTENSION")) {
    // Decide whether this language wants to replace the source
    // extension with the object extension.  For CMake 2.4
    // compatibility do this by default.
    bool replaceExt = this->NeedBackwardsCompatibility_2_4();
    if (!replaceExt) {
      std::string lang = source.GetLanguage();
      if (!lang.empty()) {
        replaceExt = this->Makefile->IsOn(
          cmStrCat("CMAKE_", lang, "_OUTPUT_EXTENSION_REPLACE"));
      }
    }

    // Remove the source extension if it is to be replaced.
    if (replaceExt || customOutputExtension) {
      keptSourceExtension = false;
      std::string::size_type dot_pos = objectName.rfind('.');
      if (dot_pos != std::string::npos) {
        objectName = objectName.substr(0, dot_pos);
      }
    }

    // Store the new extension.
    if (customOutputExtension) {
      objectName += customOutputExtension;
    } else {
      objectName += this->GlobalGenerator->GetLanguageOutputExtension(source);
    }
  }
  if (hasSourceExtension) {
    *hasSourceExtension = keptSourceExtension;
  }

  // Convert to a safe name.
  return this->CreateSafeUniqueObjectFileName(objectName, dir_max);
}